

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsLp * withoutSemiVariables
                    (HighsLp *__return_storage_ptr__,HighsLp *lp_,HighsSolution *solution,
                    double primal_feasibility_tolerance)

{
  long lVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  iterator iVar5;
  pointer pdVar6;
  iterator __position;
  bool bVar7;
  pointer pHVar8;
  HighsVarType HVar9;
  long lVar10;
  pointer pdVar11;
  iterator iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  size_type __new_size;
  double dVar20;
  double dVar21;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  HighsLp *local_280;
  ulong local_278;
  HighsSolution *local_270;
  ulong local_268;
  int local_25c;
  vector<double,_std::allocator<double>_> *local_258;
  pointer local_250;
  pointer local_248;
  vector<double,_std::allocator<double>_> *local_240;
  vector<int,_std::allocator<int>_> *local_238;
  vector<double,_std::allocator<double>_> *local_230;
  int local_224;
  ulong local_220;
  vector<int,_std::allocator<int>_> *local_218;
  vector<double,std::allocator<double>> *local_210;
  vector<double,_std::allocator<double>_> *local_208;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_200;
  long local_1f8;
  vector<double,_std::allocator<double>_> *local_1f0;
  vector<double,_std::allocator<double>_> *local_1e8;
  double local_1e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  double local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = primal_feasibility_tolerance;
  HighsLp::HighsLp(__return_storage_ptr__,lp_);
  iVar16 = __return_storage_ptr__->num_col_;
  local_1f8 = (long)iVar16;
  if (local_1f8 < 1) {
    local_224 = 0;
  }
  else {
    lVar10 = 0;
    local_224 = 0;
    do {
      local_224 = local_224 +
                  (uint)(((__return_storage_ptr__->integrality_).
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10] & ~kInteger) == kSemiContinuous);
      lVar10 = lVar10 + 1;
    } while (local_1f8 != lVar10);
  }
  uVar17 = __return_storage_ptr__->num_row_;
  local_238 = &(__return_storage_ptr__->a_matrix_).index_;
  local_268 = (ulong)local_224;
  __new_size = (long)(__return_storage_ptr__->a_matrix_).start_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[local_1f8] + local_268 * 2;
  std::vector<int,_std::allocator<int>_>::resize(local_238,__new_size);
  local_240 = &(__return_storage_ptr__->a_matrix_).value_;
  std::vector<double,_std::allocator<double>_>::resize(local_240,__new_size);
  if (0 < iVar16) {
    piVar2 = (__return_storage_ptr__->a_matrix_).start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pHVar8 = (__return_storage_ptr__->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = piVar2[local_1f8];
    local_248 = (pointer)((__return_storage_ptr__->a_matrix_).index_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + -1);
    local_250 = (pointer)((__return_storage_ptr__->a_matrix_).value_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + -1);
    lVar10 = local_1f8;
    do {
      piVar2[lVar10] = (int)__new_size;
      uVar13 = (ulong)((int)__new_size - 2);
      if ((pHVar8[lVar10 + -1] & ~kInteger) != kSemiContinuous) {
        uVar13 = __new_size & 0xffffffff;
      }
      __new_size = uVar13;
      iVar19 = piVar2[lVar10 + -1];
      if (piVar2[lVar10 + -1] < iVar14) {
        iVar19 = (int)__new_size;
        lVar15 = (long)iVar14;
        lVar18 = 0;
        do {
          *(int *)((long)local_248 + (iVar19 + lVar18) * 4) =
               *(pointer)((long)local_248 + (lVar15 + lVar18) * 4);
          *(double *)((long)local_250 + (iVar19 + lVar18) * 8) =
               *(pointer)((long)local_250 + (lVar15 + lVar18) * 8);
          lVar1 = lVar15 + lVar18;
          lVar18 = lVar18 + -1;
        } while ((long)piVar2[lVar10 + -1] < lVar1 + -1);
        __new_size = (size_type)(uint)(iVar19 + (int)lVar18);
        iVar19 = piVar2[lVar10 + -1];
      }
      iVar14 = iVar19;
      bVar7 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar7);
    if (0 < iVar16) {
      pHVar8 = (__return_storage_ptr__->integrality_).
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (__return_storage_ptr__->a_matrix_).start_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar3 = (__return_storage_ptr__->a_matrix_).index_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (__return_storage_ptr__->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar10 = 0;
      uVar13 = (ulong)uVar17;
      do {
        if ((pHVar8[lVar10] & ~kInteger) == kSemiContinuous) {
          lVar15 = (long)piVar2[lVar10 + 1];
          iVar16 = (int)uVar13;
          piVar3[lVar15 + -2] = iVar16;
          uVar13 = (ulong)(iVar16 + 2);
          piVar3[lVar15 + -1] = iVar16 + 1;
          pdVar11 = pdVar4 + lVar15 + -2;
          *pdVar11 = 1.0;
          pdVar11[1] = 1.0;
        }
        lVar10 = lVar10 + 1;
      } while (local_1f8 != lVar10);
    }
  }
  local_280 = __return_storage_ptr__;
  local_278 = (ulong)uVar17;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_220 = local_268 * 2;
  local_1c0 = (__return_storage_ptr__->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (__return_storage_ptr__->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = (__return_storage_ptr__->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_250 = (__return_storage_ptr__->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = solution->value_valid;
  if (0 < (int)local_268 && bVar7 == true) {
    uVar13 = local_220 & 0xffffffff;
    do {
      local_2a0._M_dataplus._M_p = (pointer)0x0;
      iVar12._M_current =
           (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&solution->row_value,iVar12,(double *)&local_2a0);
      }
      else {
        *iVar12._M_current = 0.0;
        (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar12._M_current + 1;
      }
      uVar17 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar17;
    } while (uVar17 != 0);
  }
  local_270 = solution;
  if (0 < (int)local_1f8) {
    local_218 = &(__return_storage_ptr__->a_matrix_).start_;
    local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &__return_storage_ptr__->col_names_;
    local_200 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &__return_storage_ptr__->row_names_;
    local_1e8 = &__return_storage_ptr__->col_cost_;
    local_230 = &__return_storage_ptr__->col_lower_;
    local_1f0 = &__return_storage_ptr__->col_upper_;
    local_208 = &__return_storage_ptr__->row_lower_;
    local_210 = (vector<double,std::allocator<double>> *)&__return_storage_ptr__->row_upper_;
    local_258 = &solution->col_value;
    pHVar8 = (__return_storage_ptr__->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    local_268 = local_268 & 0xffffffff00000000;
    local_25c = 0;
    do {
      if ((pHVar8[lVar10] & ~kInteger) == kSemiContinuous) {
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar12._M_current =
             (__return_storage_ptr__->col_cost_).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_1e8,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = 0.0;
          (__return_storage_ptr__->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar12._M_current =
             (__return_storage_ptr__->col_lower_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->col_lower_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_230,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = 0.0;
          (__return_storage_ptr__->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        iVar12._M_current =
             (__return_storage_ptr__->col_upper_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->col_upper_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_1f0,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = 1.0;
          (__return_storage_ptr__->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar12._M_current =
             (__return_storage_ptr__->row_lower_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_208,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = 0.0;
          (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        iVar12._M_current =
             (__return_storage_ptr__->row_upper_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_210,iVar12,(double *)&kHighsInf);
        }
        else {
          *iVar12._M_current = INFINITY;
          (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        if (local_1c8 != local_1c0) {
          local_2a0._M_string_length = 0;
          local_2a0.field_2._M_local_buf[0] = '\0';
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"semi_binary_",0xc);
          std::ostream::operator<<((ostream *)local_1a8,local_25c);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1d8,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          local_25c = local_25c + 1;
        }
        if (local_248 != local_250) {
          local_2a0._M_string_length = 0;
          local_2a0.field_2._M_local_buf[0] = '\0';
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"semi_lb_",8);
          std::ostream::operator<<((ostream *)local_1a8,(int)local_268);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_200,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
        }
        local_2a0._M_dataplus._M_p._0_4_ = (int)local_278;
        iVar5._M_current =
             (__return_storage_ptr__->a_matrix_).index_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar5._M_current ==
            (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_238,iVar5,(int *)&local_2a0);
        }
        else {
          *iVar5._M_current = (int)local_278;
          (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_2a0._M_dataplus._M_p =
             (pointer)((ulong)(__return_storage_ptr__->col_lower_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10] ^ 0x8000000000000000);
        iVar12._M_current =
             (__return_storage_ptr__->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_240,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = (double)local_2a0._M_dataplus._M_p;
          (__return_storage_ptr__->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar12._M_current + 1;
        }
        iVar16 = (int)local_278 + 1;
        if (bVar7 != false) {
          pdVar4 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_1d0 = pdVar4[lVar10];
          if (local_1d0 <= local_1e0) {
            pdVar4[lVar10] = 0.0;
            local_2a0._M_dataplus._M_p = (pointer)0x0;
            iVar12._M_current =
                 (local_270->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar12._M_current !=
                (local_270->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar12._M_current = 0.0;
              goto LAB_002450a8;
            }
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (local_258,iVar12,(double *)&local_2a0);
          }
          else {
            dVar20 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar10];
            dVar21 = local_1d0;
            if (local_1d0 <= dVar20) {
              dVar21 = dVar20;
            }
            pdVar4[lVar10] = dVar21;
            local_2a0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
            iVar12._M_current =
                 (local_270->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar12._M_current ==
                (local_270->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (local_258,iVar12,(double *)&local_2a0);
            }
            else {
              *iVar12._M_current = 1.0;
LAB_002450a8:
              (local_270->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar12._M_current + 1;
            }
          }
          pdVar4 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar20 = pdVar4[lVar10];
          dVar21 = dVar20 - local_1d0;
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            piVar2 = (local_218->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar14 = piVar2[lVar10];
            lVar15 = (long)iVar14;
            iVar19 = piVar2[lVar10 + 1];
            pdVar11 = (local_270->row_value).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (iVar14 < iVar19) {
              pdVar6 = (local_240->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar2 = (local_238->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                iVar14 = piVar2[lVar15];
                pdVar11[iVar14] = pdVar6[lVar15] * dVar21 + pdVar11[iVar14];
                lVar15 = lVar15 + 1;
              } while (iVar19 != lVar15);
              dVar20 = pdVar4[lVar10];
            }
          }
          else {
            pdVar11 = (local_270->row_value).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          dVar21 = *(double *)
                    ((long)pdVar4 +
                    (((long)(__return_storage_ptr__->col_cost_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->col_cost_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000 >> 0x1d));
          pdVar11[(int)local_278] =
               dVar20 - (__return_storage_ptr__->col_lower_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10] * dVar21;
          pdVar11[iVar16] =
               pdVar4[lVar10] -
               dVar21 * (__return_storage_ptr__->col_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10];
        }
        local_2a0._M_dataplus._M_p = &DAT_fff0000000000000;
        iVar12._M_current =
             (__return_storage_ptr__->row_lower_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_208,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = -INFINITY;
          (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar12._M_current =
             (__return_storage_ptr__->row_upper_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_210,iVar12,
                     (double *)&local_2a0);
        }
        else {
          *iVar12._M_current = 0.0;
          (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        if (local_248 != local_250) {
          local_2a0._M_string_length = 0;
          local_2a0.field_2._M_local_buf[0] = '\0';
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"semi_ub_",8);
          std::ostream::operator<<((ostream *)local_1a8,(int)local_268);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_200,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          local_268 = CONCAT44(local_268._4_4_,(int)local_268 + 1);
        }
        local_2a0._M_dataplus._M_p._0_4_ = iVar16;
        iVar5._M_current =
             (__return_storage_ptr__->a_matrix_).index_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar5._M_current ==
            (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_238,iVar5,(int *)&local_2a0);
        }
        else {
          *iVar5._M_current = iVar16;
          (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_2a0._M_dataplus._M_p =
             (pointer)((ulong)(__return_storage_ptr__->col_upper_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10] ^ 0x8000000000000000);
        iVar12._M_current =
             (__return_storage_ptr__->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_240,iVar12,(double *)&local_2a0);
        }
        else {
          *iVar12._M_current = (double)local_2a0._M_dataplus._M_p;
          (__return_storage_ptr__->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar12._M_current + 1;
        }
        iVar16 = (int)((ulong)((long)(__return_storage_ptr__->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->a_matrix_).index_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_2a0._M_dataplus._M_p._0_4_ = iVar16;
        iVar5._M_current =
             (__return_storage_ptr__->a_matrix_).start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar5._M_current ==
            (__return_storage_ptr__->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_218,iVar5,(int *)&local_2a0);
        }
        else {
          *iVar5._M_current = iVar16;
          (__return_storage_ptr__->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_2a0._M_dataplus._M_p._0_1_ = 1;
        __position._M_current =
             (__return_storage_ptr__->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_realloc_insert<HighsVarType>
                    (&__return_storage_ptr__->integrality_,__position,(HighsVarType *)&local_2a0);
        }
        else {
          *__position._M_current = kInteger;
          (__return_storage_ptr__->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pHVar8 = (__return_storage_ptr__->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pHVar8[lVar10] == kSemiContinuous) {
          HVar9 = kContinuous;
LAB_002453df:
          pHVar8[lVar10] = HVar9;
        }
        else if (pHVar8[lVar10] == kSemiInteger) {
          HVar9 = kInteger;
          goto LAB_002453df;
        }
        local_278 = (ulong)((int)local_278 + 2);
        (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar10] = 0.0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != local_1f8);
  }
  __return_storage_ptr__->num_col_ = __return_storage_ptr__->num_col_ + local_224;
  __return_storage_ptr__->num_row_ = __return_storage_ptr__->num_row_ + (int)local_220;
  HighsLpMods::clear(&__return_storage_ptr__->mods_);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

HighsLp withoutSemiVariables(const HighsLp& lp_, HighsSolution& solution,
                             const double primal_feasibility_tolerance) {
  HighsLp lp = lp_;
  HighsInt num_col = lp.num_col_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_semi_variables = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      num_semi_variables++;
  }
  assert(num_semi_variables);
  // Insert spaces for index/value of new coefficients for
  // semi-variables
  vector<HighsInt>& start = lp.a_matrix_.start_;
  vector<HighsInt>& index = lp.a_matrix_.index_;
  vector<double>& value = lp.a_matrix_.value_;
  HighsInt num_nz = start[num_col];
  HighsInt new_num_nz = num_nz + 2 * num_semi_variables;
  HighsInt new_el = new_num_nz;
  index.resize(new_num_nz);
  value.resize(new_num_nz);
  for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
    HighsInt from_el = start[iCol + 1] - 1;
    start[iCol + 1] = new_el;
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      new_el -= 2;
    for (HighsInt iEl = from_el; iEl >= start[iCol]; iEl--) {
      new_el--;
      index[new_el] = index[iEl];
      value[new_el] = value[iEl];
    }
  }
  assert(new_el == 0);
  // Insert the new coefficients for semi-variables
  HighsInt row_num = num_row;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      HighsInt iEl = start[iCol + 1] - 2;
      index[iEl] = row_num++;
      value[iEl] = 1;
      iEl++;
      index[iEl] = row_num++;
      value[iEl] = 1;
    }
  }
  num_nz = start[num_col];
  new_num_nz = num_nz + 2 * num_semi_variables;
  row_num = num_row;
  HighsInt semi_col_num = 0;
  HighsInt semi_row_num = 0;
  // Insert the new variables and their coefficients
  std::stringstream ss;
  const bool has_col_names = (lp.col_names_.size() != 0);
  const bool has_row_names = (lp.row_names_.size() != 0);
  const bool has_solution = solution.value_valid;
  if (has_solution) {
    // Create zeroed row values for the new rows
    assert((HighsInt)solution.row_value.size() == lp_.num_row_);
    for (HighsInt iCol = 0; iCol < 2 * num_semi_variables; iCol++)
      solution.row_value.push_back(0);
    assert((HighsInt)solution.col_value.size() == lp_.num_col_);
    assert((HighsInt)solution.row_value.size() ==
           lp_.num_row_ + 2 * num_semi_variables);
  }
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      // Add a binary variable with zero cost
      lp.col_cost_.push_back(0);
      lp.col_lower_.push_back(0);
      lp.col_upper_.push_back(1);
      // Complete x - l*y >= 0
      lp.row_lower_.push_back(0);
      lp.row_upper_.push_back(kHighsInf);
      if (has_col_names) {
        // Create a column name
        ss.str(std::string());
        ss << "semi_binary_" << semi_col_num++;
        lp.col_names_.push_back(ss.str());
      }
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_lb_" << semi_row_num;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_lower_[iCol]);
      // Accommodate any primal solution
      if (has_solution) {
        // Record the previous solution value so any change can be
        // determined
        const double prev_primal = solution.col_value[iCol];
        if (solution.col_value[iCol] <= primal_feasibility_tolerance) {
          // Currently at or below zero, so binary is 0
          solution.col_value[iCol] = 0;
          solution.col_value.push_back(0);
        } else {
          // Otherwise, solution is at least lower bound, and binary
          // is 1
          solution.col_value[iCol] =
              std::max(lp.col_lower_[iCol], solution.col_value[iCol]);
          solution.col_value.push_back(1);
        }
        const double dl_primal = solution.col_value[iCol] - prev_primal;
        if (dl_primal) {
          // Change in primal value, so update row values. NB start
          // has been extended to incorporate the values in this
          // column for the new rows. Their solution values are zero,
          // but will be set later
          for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
            solution.row_value[index[iEl]] += dl_primal * value[iEl];
        }
        const HighsInt new_col = lp.col_cost_.size() - 1;
        const double binary_value = solution.col_value[new_col];
        solution.row_value[row_num - 1] =
            solution.col_value[iCol] - lp.col_lower_[iCol] * binary_value;
        solution.row_value[row_num] =
            solution.col_value[iCol] - lp.col_upper_[iCol] * binary_value;
      }
      // Complete x - u*y <= 0
      lp.row_lower_.push_back(-kHighsInf);
      lp.row_upper_.push_back(0);
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_ub_" << semi_row_num++;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_upper_[iCol]);
      // Add the next start
      start.push_back(index.size());
      lp.integrality_.push_back(HighsVarType::kInteger);
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous) {
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      } else if (lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        lp.integrality_[iCol] = HighsVarType::kInteger;
      }
      // Change the lower bound on the semi-variable to zero. Cannot
      // do this earlier, as its original value is used in constraint
      // 0 <= x-l*y
      lp.col_lower_[iCol] = 0;
    }
  }
  num_col += num_semi_variables;
  lp.num_col_ += num_semi_variables;
  lp.num_row_ += 2 * num_semi_variables;
  assert((HighsInt)index.size() == new_num_nz);
  // Clear any modifications inherited from lp_
  lp.mods_.clear();
  return lp;
}